

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O1

void Timidity::LoadSubChunks(RIFF_Chunk *chunk,BYTE *data,DWORD left)

{
  DWORD *pDVar1;
  DWORD DVar2;
  RIFF_Chunk *pRVar3;
  RIFF_Chunk *chunk_00;
  RIFF_Chunk **ppRVar4;
  uint uVar5;
  RIFF_Chunk *pRVar6;
  uint uVar7;
  DWORD *data_00;
  
  if (8 < left) {
    do {
      chunk_00 = (RIFF_Chunk *)operator_new(0x28);
      chunk_00->magic = 0;
      chunk_00->length = 0;
      *(undefined8 *)&chunk_00->subtype = 0;
      chunk_00->data = (BYTE *)0x0;
      chunk_00->child = (RIFF_Chunk *)0x0;
      chunk_00->next = (RIFF_Chunk *)0x0;
      ppRVar4 = &chunk->child;
      pRVar3 = (RIFF_Chunk *)0x0;
      do {
        pRVar6 = pRVar3;
        pRVar3 = *ppRVar4;
        ppRVar4 = &pRVar3->next;
      } while (pRVar3 != (RIFF_Chunk *)0x0);
      ppRVar4 = &pRVar6->next;
      if (pRVar6 == (RIFF_Chunk *)0x0) {
        ppRVar4 = &chunk->child;
      }
      *ppRVar4 = chunk_00;
      DVar2 = *(DWORD *)data;
      chunk_00->magic = DVar2;
      uVar5 = *(uint *)((long)data + 4);
      chunk_00->length = uVar5;
      pDVar1 = (DWORD *)((long)data + 8);
      uVar7 = left - 8;
      chunk_00->data = (BYTE *)pDVar1;
      if (uVar7 < uVar5) {
        chunk_00->length = uVar7;
      }
      uVar5 = chunk_00->length;
      data_00 = pDVar1;
      if (3 < uVar5 && (DVar2 == 0x5453494c || DVar2 == 0x46464952)) {
        chunk_00->subtype = *(DWORD *)((long)data + 8);
        data_00 = (DWORD *)((long)data + 0xc);
        uVar5 = uVar5 - 4;
      }
      if ((DVar2 == 0x5453494c) || (DVar2 == 0x46464952)) {
        LoadSubChunks(chunk_00,(BYTE *)data_00,uVar5);
      }
      uVar5 = (chunk_00->length & 1) + chunk_00->length;
      data = (BYTE *)((long)pDVar1 + (ulong)uVar5);
      left = uVar7 - uVar5;
    } while (8 < left);
  }
  return;
}

Assistant:

static void LoadSubChunks(RIFF_Chunk *chunk, BYTE *data, DWORD left)
{
	BYTE *subchunkData;
	DWORD subchunkDataLen;

	while ( left > 8 ) {
		RIFF_Chunk *child = new RIFF_Chunk;
		RIFF_Chunk *next, *prev = NULL;
		for ( next = chunk->child; next; next = next->next ) {
			prev = next;
		}
		if ( prev ) {
			prev->next = child;
		} else {
			chunk->child = child;
		}

		child->magic = *(DWORD *)data;
		data += 4;
		left -= 4;
		child->length = LittleLong(*(DWORD *)data);
		data += 4;
		left -= 4;
		child->data = data;

		if ( child->length > left ) {
			child->length = left;
		}

		subchunkData = child->data;
		subchunkDataLen = child->length;
		if ( ChunkHasSubType(child->magic) && subchunkDataLen >= 4 ) {
			child->subtype = *(DWORD *)subchunkData;
			subchunkData += 4;
			subchunkDataLen -= 4;
		}
		if ( ChunkHasSubChunks(child->magic) ) {
			LoadSubChunks(child, subchunkData, subchunkDataLen);
		}

		data += child->length + (child->length & 1);
		left -= child->length + (child->length & 1);
	}
}